

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16549e0::ConvolveScaleTestBase<unsigned_char>::~ConvolveScaleTestBase
          (ConvolveScaleTestBase<unsigned_char> *this)

{
  code *pcVar1;
  ConvolveScaleTestBase<unsigned_char> *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~ConvolveScaleTestBase() override { delete image_; }